

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

void __thiscall CNetAddr::SetIP(CNetAddr *this,CNetAddr *ipIn)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  switch(ipIn->m_net) {
  case NET_UNROUTABLE:
  case NET_MAX:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                  ,0x82,"void CNetAddr::SetIP(const CNetAddr &)");
  case NET_IPV4:
    uVar1 = (ipIn->m_addr)._size;
    uVar3 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
    }
    if (uVar3 != 4) {
      __assert_fail("ipIn.m_addr.size() == ADDR_IPV4_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                    ,0x6f,"void CNetAddr::SetIP(const CNetAddr &)");
    }
    break;
  case NET_IPV6:
    uVar1 = (ipIn->m_addr)._size;
    uVar3 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
    }
    if (uVar3 != 0x10) {
      __assert_fail("ipIn.m_addr.size() == ADDR_IPV6_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                    ,0x72,"void CNetAddr::SetIP(const CNetAddr &)");
    }
    break;
  case NET_ONION:
    if ((ipIn->m_addr)._size != 0x31) {
      __assert_fail("ipIn.m_addr.size() == ADDR_TORV3_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                    ,0x75,"void CNetAddr::SetIP(const CNetAddr &)");
    }
    break;
  case NET_I2P:
    if ((ipIn->m_addr)._size != 0x31) {
      __assert_fail("ipIn.m_addr.size() == ADDR_I2P_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                    ,0x78,"void CNetAddr::SetIP(const CNetAddr &)");
    }
    break;
  case NET_CJDNS:
    uVar1 = (ipIn->m_addr)._size;
    uVar3 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
    }
    if (uVar3 != 0x10) {
      __assert_fail("ipIn.m_addr.size() == ADDR_CJDNS_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                    ,0x7b,"void CNetAddr::SetIP(const CNetAddr &)");
    }
    break;
  case NET_INTERNAL:
    uVar1 = (ipIn->m_addr)._size;
    uVar3 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar3 = uVar1;
    }
    if (uVar3 != 10) {
      __assert_fail("ipIn.m_addr.size() == ADDR_INTERNAL_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                    ,0x7e,"void CNetAddr::SetIP(const CNetAddr &)");
    }
  }
  this->m_net = ipIn->m_net;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::operator=(&this->m_addr,&ipIn->m_addr);
  return;
}

Assistant:

void CNetAddr::SetIP(const CNetAddr& ipIn)
{
    // Size check.
    switch (ipIn.m_net) {
    case NET_IPV4:
        assert(ipIn.m_addr.size() == ADDR_IPV4_SIZE);
        break;
    case NET_IPV6:
        assert(ipIn.m_addr.size() == ADDR_IPV6_SIZE);
        break;
    case NET_ONION:
        assert(ipIn.m_addr.size() == ADDR_TORV3_SIZE);
        break;
    case NET_I2P:
        assert(ipIn.m_addr.size() == ADDR_I2P_SIZE);
        break;
    case NET_CJDNS:
        assert(ipIn.m_addr.size() == ADDR_CJDNS_SIZE);
        break;
    case NET_INTERNAL:
        assert(ipIn.m_addr.size() == ADDR_INTERNAL_SIZE);
        break;
    case NET_UNROUTABLE:
    case NET_MAX:
        assert(false);
    } // no default case, so the compiler can warn about missing cases

    m_net = ipIn.m_net;
    m_addr = ipIn.m_addr;
}